

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 c_v64_unziplo_8(c_v64 a,c_v64 b)

{
  return (c_v64)(b.u64 & 0xff |
                 (ulong)(a.u32[0] & 0xff0000) << 0x18 |
                 (a.u64 & 0xff00000000) << 0x10 | (a.u64 & 0xff000000000000) << 8 |
                 (a.u64 & 0xff) << 0x20 | (ulong)((uint)((ulong)b >> 0x18) & 0xff000000) |
                 (ulong)((uint)((ulong)b >> 0x10) & 0xff0000) |
                (ulong)((uint)((ulong)b >> 8) & 0xff00));
}

Assistant:

SIMD_INLINE c_v64 _c_v64_unzip_8(c_v64 a, c_v64 b, int mode) {
  c_v64 t;
  if (mode) {
    t.u8[7] = b.u8[7];
    t.u8[6] = b.u8[5];
    t.u8[5] = b.u8[3];
    t.u8[4] = b.u8[1];
    t.u8[3] = a.u8[7];
    t.u8[2] = a.u8[5];
    t.u8[1] = a.u8[3];
    t.u8[0] = a.u8[1];
  } else {
    t.u8[7] = a.u8[6];
    t.u8[6] = a.u8[4];
    t.u8[5] = a.u8[2];
    t.u8[4] = a.u8[0];
    t.u8[3] = b.u8[6];
    t.u8[2] = b.u8[4];
    t.u8[1] = b.u8[2];
    t.u8[0] = b.u8[0];
  }
  return t;
}